

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Stress::LongRunningTests::init(LongRunningTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  FeatureProbabilities *pFVar3;
  TestCaseGroup *pTVar4;
  LongStressCase *pLVar5;
  TestContext *pTVar6;
  RenderContext *pRVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong extraout_RAX;
  ulong uVar11;
  int local_e5c;
  int local_de4;
  FeatureProbabilities local_d84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  ProgramContext local_c88;
  ProgramContext local_be0;
  undefined1 local_b38 [8];
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_4;
  FeatureProbabilities local_b18;
  allocator<deqp::gls::ProgramContext> local_ad9;
  ProgramContext local_ad8;
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  uint local_954;
  TestCaseGroup *pTStack_950;
  int memoryLimitNdx_2;
  TestCaseGroup *mixedGroup;
  TestCaseGroup *pTStack_940;
  int caseNdx_3;
  TestCaseGroup *shaderGroup;
  FeatureProbabilities local_8fc;
  ProgramContext local_8c0;
  ProgramContext local_818;
  undefined1 local_770 [8];
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_3;
  int caseNdx_2;
  TestCaseGroup *drawCallGroup;
  FeatureProbabilities local_708;
  FeatureProbabilities local_6cc;
  FeatureProbabilities local_690;
  allocator<deqp::gls::ProgramContext> local_651;
  ProgramContext local_650;
  undefined1 local_5a8 [8];
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  allocator<deqp::gls::ProgramContext> local_4c1;
  ProgramContext local_4c0;
  undefined1 local_418 [8];
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts_1;
  int local_3f8;
  int numTextures;
  int caseNdx_1;
  int memoryLimitNdx_1;
  TestCaseGroup *textureGroup;
  FeatureProbabilities local_3a8;
  FeatureProbabilities local_36c;
  FeatureProbabilities local_330;
  undefined1 local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_22c;
  int local_228;
  int redundantBufferFactor;
  int caseNdx;
  int memoryLimitNdx;
  TestCaseGroup *bufferGroup;
  FeatureProbabilities local_1dc;
  FeatureProbabilities local_1a0;
  FeatureProbabilities local_164;
  FeatureProbabilities local_128;
  allocator<deqp::gls::ProgramContext> local_e9;
  ProgramContext local_e8;
  undefined1 local_40 [8];
  vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> contexts;
  ProgramLibrary local_14;
  LongRunningTests *pLStack_10;
  ProgramLibrary progLib;
  LongRunningTests *this_local;
  
  pLStack_10 = this;
  deqp::gls::LongStressTestUtil::ProgramLibrary::ProgramLibrary(&local_14,GLSL_VERSION_300_ES);
  if (init()::memoryLimitCases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar2 != 0) {
      init::MemCase::MemCase
                (init::memoryLimitCases,"_low_memory","; use a low buffer memory usage limit",
                 0x800000,2);
      init::MemCase::MemCase
                (init::memoryLimitCases + 1,"_high_memory","; use a high buffer memory usage limit",
                 0x10000000,0x40);
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext(&local_e8,&local_14,4);
  std::allocator<deqp::gls::ProgramContext>::allocator(&local_e9);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_40,1,&local_e8,&local_e9);
  std::allocator<deqp::gls::ProgramContext>::~allocator(&local_e9);
  deqp::gls::ProgramContext::~ProgramContext(&local_e8);
  if (init()::cases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::cases);
    if (iVar2 != 0) {
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_128);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadBuffer(&local_128,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init::cases,"always_reupload",
                 "Re-upload buffer data at the beginning of each iteration",-1,pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_164);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadBuffer(&local_164,1.0);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithBufferData(pFVar3,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init::cases + 1,"always_reupload_bufferdata",
                 "Re-upload buffer data at the beginning of each iteration, using glBufferData",-1,
                 pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_1a0);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteBuffer(&local_1a0,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init::cases + 2,"always_delete",
                 "Delete buffers at the end of each iteration, and re-create at the beginning of the next"
                 ,-1,pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_1dc);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulBufferMemoryUsage
                         (&local_1dc,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init::cases + 3,"wasteful",
                 "Don\'t reuse buffers, and only delete them when given memory limit is reached",2,
                 pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities
                ((FeatureProbabilities *)&bufferGroup);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pSeparateAttribBuffers
                         ((FeatureProbabilities *)&bufferGroup,1.0);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulBufferMemoryUsage
                         (pFVar3,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init::cases + 4,"separate_attribute_buffers_wasteful",
                 "Give each vertex attribute its own buffer",2,pFVar3);
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"buffer","Buffer stress tests");
  _caseNdx = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (redundantBufferFactor = 0; redundantBufferFactor < 2;
      redundantBufferFactor = redundantBufferFactor + 1) {
    for (local_228 = 0; pTVar4 = _caseNdx, local_228 < 5; local_228 = local_228 + 1) {
      if (init::cases[local_228].redundantBufferFactor < 1) {
        local_de4 = init::memoryLimitCases[redundantBufferFactor].redundantBufferFactor;
      }
      else {
        local_de4 = init::cases[local_228].redundantBufferFactor;
      }
      local_22c = local_de4;
      pLVar5 = (LongStressCase *)operator_new(0x178);
      local_2f1 = 1;
      pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
      pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::string::string((string *)&local_290);
      std::operator+(&local_270,&local_290,init::cases[local_228].name);
      std::operator+(&local_250,&local_270,init::memoryLimitCases[redundantBufferFactor].nameSuffix)
      ;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::string((string *)&local_2f0);
      std::operator+(&local_2d0,&local_2f0,init::cases[local_228].desc);
      std::operator+(&local_2b0,&local_2d0,init::memoryLimitCases[redundantBufferFactor].descSuffix)
      ;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      deqp::gls::LongStressCase::LongStressCase
                (pLVar5,pTVar6,pRVar7,pcVar8,pcVar9,0,
                 init::memoryLimitCases[redundantBufferFactor].limit,1,50000,
                 (vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
                 local_40,&init::cases[local_228].probs,0x88e8,0x88e8,local_22c,false);
      local_2f1 = 0;
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
    }
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_40);
  if (init()::memoryLimitCases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar2 != 0) {
      init::MemCase::MemCase
                ((MemCase *)init()::memoryLimitCases,"_low_memory",
                 "; use a low texture memory usage limit",0x800000,6);
      init::MemCase::MemCase
                ((MemCase *)(init()::memoryLimitCases + 1),"_high_memory",
                 "; use a high texture memory usage limit",0x10000000,0xc0);
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  if (init()::cases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::cases);
    if (iVar2 != 0) {
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_330);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadTexture(&local_330,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases,"always_reupload",
                 "Re-upload texture data at the beginning of each iteration",-1,pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_36c);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadTexture(&local_36c,1.0);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithTexImage(pFVar3,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 1,"always_reupload_teximage",
                 "Re-upload texture data at the beginning of each iteration, using glTexImage*",-1,
                 pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_3a8);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteTexture(&local_3a8,1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 2,"always_delete",
                 "Delete textures at the end of each iteration, and re-create at the beginning of the next"
                 ,-1,pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities
                ((FeatureProbabilities *)((long)&textureGroup + 4));
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulTextureMemoryUsage
                         ((FeatureProbabilities *)((long)&textureGroup + 4),1.0);
      init()::Case::Case(char_const*,char_const*,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 3,"wasteful",
                 "Don\'t reuse textures, and only delete them when given memory limit is reached",6,
                 pFVar3);
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"texture","Texture stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (numTextures = 0; numTextures < 2; numTextures = numTextures + 1) {
    for (local_3f8 = 0; local_3f8 < 4; local_3f8 = local_3f8 + 1) {
      if (init()::cases[local_3f8].numTextures < 1) {
        local_e5c = init()::memoryLimitCases[numTextures].numTextures;
      }
      else {
        local_e5c = init()::cases[local_3f8].numTextures;
      }
      contexts_1.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_e5c;
      deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
                (&local_4c0,&local_14,local_e5c,0x200,0x200,0.1);
      std::allocator<deqp::gls::ProgramContext>::allocator(&local_4c1);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
                ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
                 local_418,1,&local_4c0,&local_4c1);
      std::allocator<deqp::gls::ProgramContext>::~allocator(&local_4c1);
      deqp::gls::ProgramContext::~ProgramContext(&local_4c0);
      pLVar5 = (LongStressCase *)operator_new(0x178);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
      pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::string::string((string *)&local_528);
      std::operator+(&local_508,&local_528,init()::cases[local_3f8].name);
      std::operator+(&local_4e8,&local_508,init()::memoryLimitCases[numTextures].nameSuffix);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::string((string *)&local_588);
      std::operator+(&local_568,&local_588,init()::cases[local_3f8].desc);
      std::operator+(&local_548,&local_568,init()::memoryLimitCases[numTextures].descSuffix);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      deqp::gls::LongStressCase::LongStressCase
                (pLVar5,pTVar6,pRVar7,pcVar8,pcVar9,init()::memoryLimitCases[numTextures].limit,
                 0x100000,1,10000,
                 (vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
                 local_418,&init()::cases[local_3f8].probs,0x88e4,0x88e4,1,false);
      contexts_2.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
                ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
                 local_418);
    }
  }
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
            (&local_650,&local_14,1,0x80,0x80,0.5);
  std::allocator<deqp::gls::ProgramContext>::allocator(&local_651);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_5a8,1,&local_650,&local_651);
  std::allocator<deqp::gls::ProgramContext>::~allocator(&local_651);
  deqp::gls::ProgramContext::~ProgramContext(&local_650);
  if (init()::cases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::cases);
    if (iVar2 != 0) {
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_690);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pClientMemoryAttributeData
                         (&local_690,1.0);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pClientMemoryIndexData(pFVar3,1.0);
      init()::Case::Case(char_const*,char_const*,int,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases,"client_memory_data",
                 "Use client-memory for index and attribute data, instead of GL buffers",200,500,
                 pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_6cc);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pUseDrawArrays(&local_6cc,0.5);
      init()::Case::Case(char_const*,char_const*,int,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 1,"vary_draw_function",
                 "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability"
                 ,200,500,pFVar3);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_708);
      init()::Case::Case(char_const*,char_const*,int,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 2,"few_big_calls",
                 "Per iteration, do a few draw calls with a big number of triangles per call",2,
                 50000,&local_708);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities
                ((FeatureProbabilities *)((long)&drawCallGroup + 4));
      init()::Case::Case(char_const*,char_const*,int,int,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 3,"many_small_calls",
                 "Per iteration, do many draw calls with a small number of triangles per call",2000,
                 0x32,(Probs *)((long)&drawCallGroup + 4));
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"draw_call","Draw call stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (contexts_3.
       super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      contexts_3.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
      contexts_3.
      super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           contexts_3.
           super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pLVar5 = (LongStressCase *)operator_new(0x178);
    pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
    pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    lVar10 = (long)contexts_3.
                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar5,pTVar6,pRVar7,init()::cases[lVar10].name,init()::cases[lVar10].desc,0x100000,
               0x200000,init()::cases[lVar10].drawCallsPerIteration,
               init()::cases[lVar10].numTrisPerDrawCall,
               (vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_5a8,&init()::cases[lVar10].probs,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_5a8);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_770);
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
            (&local_818,&local_14,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::push_back
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_770,&local_818);
  deqp::gls::ProgramContext::~ProgramContext(&local_818);
  deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
            (&local_8c0,&local_14,0x200,0x200);
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::push_back
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_770,&local_8c0);
  deqp::gls::ProgramContext::~ProgramContext(&local_8c0);
  if (init()::cases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::cases);
    if (iVar2 != 0) {
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_8fc);
      init()::Case::Case(char_const*,char_const*,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases,"several_programs",
                 "Use several different programs, choosing between them uniformly on each iteration"
                 ,&local_8fc);
      deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities
                ((FeatureProbabilities *)&shaderGroup);
      pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRebuildProgram
                         ((FeatureProbabilities *)&shaderGroup,1.0);
      init()::Case::Case(char_const*,char_const*,deqp::gls::LongStressCase::
      FeatureProbabilities_const__
                (init()::cases + 1,"several_programs_always_rebuild",
                 "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program"
                 ,pFVar3);
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"program","Shader program stress tests");
  pTStack_940 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (mixedGroup._4_4_ = 0; pTVar4 = pTStack_940, mixedGroup._4_4_ < 2;
      mixedGroup._4_4_ = mixedGroup._4_4_ + 1) {
    pLVar5 = (LongStressCase *)operator_new(0x178);
    pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
    pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    lVar10 = (long)mixedGroup._4_4_;
    deqp::gls::LongStressCase::LongStressCase
              (pLVar5,pTVar6,pRVar7,init()::cases[lVar10].name,init()::cases[lVar10].desc,0x300000,
               0x100000,1,10000,
               (vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_770,&init()::cases[lVar10].probs,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  }
  std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
            ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
             local_770);
  if (init()::memoryLimitCases == '\0') {
    iVar2 = __cxa_guard_acquire(&init()::memoryLimitCases);
    if (iVar2 != 0) {
      init::MemCase::MemCase
                ((MemCase *)init()::memoryLimitCases,"_low_memory","; use a low memory usage limit",
                 0x800000,0x800000);
      init::MemCase::MemCase
                ((MemCase *)(init()::memoryLimitCases + 1),"_high_memory",
                 "; use a high memory usage limit",0x8000000,0x8000000);
      __cxa_guard_release(&init()::memoryLimitCases);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"mixed","Mixed stress tests");
  pTStack_950 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_954 = 0;
  uVar11 = extraout_RAX;
  while (pTVar4 = pTStack_950, (int)local_954 < 2) {
    pLVar5 = (LongStressCase *)operator_new(0x178);
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
    pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::__cxx11::string::string((string *)&local_9b8);
    std::operator+(&local_998,&local_9b8,"buffer_texture_wasteful");
    std::operator+(&local_978,&local_998,init()::memoryLimitCases[(int)local_954].nameSuffix);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&local_a18);
    std::operator+(&local_9f8,&local_a18,"Use both buffers and textures wastefully");
    std::operator+(&local_9d8,&local_9f8,init()::memoryLimitCases[(int)local_954].descSuffix);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar2 = init()::memoryLimitCases[(int)local_954].texLimit;
    iVar1 = init()::memoryLimitCases[(int)local_954].bufLimit;
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
              (&local_ad8,&local_14,4,0x200,0x200);
    std::allocator<deqp::gls::ProgramContext>::allocator(&local_ad9);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
              (&local_a30,1,&local_ad8,&local_ad9);
    deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_b18);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadTexture(&local_b18,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithTexImage(pFVar3,0.5);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadBuffer(pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithBufferData(pFVar3,0.5);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteTexture(pFVar3,0.2);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteBuffer(pFVar3,0.2);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulTextureMemoryUsage
                       (pFVar3,0.5);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulBufferMemoryUsage(pFVar3,0.5)
    ;
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRandomBufferUploadTarget(pFVar3,1.0);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRandomBufferUsage(pFVar3,1.0);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar5,pTVar6,pRVar7,pcVar8,pcVar9,iVar2,iVar1,1,10000,&local_a30,pFVar3,0x88e4,
               0x88e4,1,false);
    contexts_4.
    super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              (&local_a30);
    std::allocator<deqp::gls::ProgramContext>::~allocator(&local_ad9);
    deqp::gls::ProgramContext::~ProgramContext(&local_ad8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::vector
              ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_b38);
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateFragmentPointLightContext
              (&local_be0,&local_14,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::push_back
              ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_b38,&local_be0);
    deqp::gls::ProgramContext::~ProgramContext(&local_be0);
    deqp::gls::LongStressTestUtil::ProgramLibrary::generateVertexUniformLoopLightContext
              (&local_c88,&local_14,0x200,0x200);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::push_back
              ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_b38,&local_c88);
    deqp::gls::ProgramContext::~ProgramContext(&local_c88);
    pTVar4 = pTStack_950;
    pLVar5 = (LongStressCase *)operator_new(0x178);
    pTVar6 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
    pRVar7 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::__cxx11::string::string((string *)&local_ce8);
    std::operator+(&local_cc8,&local_ce8,"random");
    std::operator+(&local_ca8,&local_cc8,init()::memoryLimitCases[(int)local_954].nameSuffix);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&local_d48);
    std::operator+(&local_d28,&local_d48,"Highly random behavior");
    std::operator+(&local_d08,&local_d28,init()::memoryLimitCases[(int)local_954].descSuffix);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar2 = init()::memoryLimitCases[(int)local_954].texLimit;
    iVar1 = init()::memoryLimitCases[(int)local_954].bufLimit;
    deqp::gls::LongStressCase::FeatureProbabilities::FeatureProbabilities(&local_d84);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRebuildProgram(&local_d84,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadTexture(pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithTexImage(pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadBuffer(pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pReuploadWithBufferData(pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteTexture(pFVar3,0.2);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pDeleteBuffer(pFVar3,0.2);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulTextureMemoryUsage
                       (pFVar3,0.3);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pWastefulBufferMemoryUsage(pFVar3,0.3)
    ;
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pClientMemoryAttributeData(pFVar3,0.2)
    ;
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pClientMemoryIndexData(pFVar3,0.2);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pSeparateAttribBuffers(pFVar3,0.4);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pUseDrawArrays(pFVar3,0.4);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRandomBufferUploadTarget(pFVar3,1.0);
    pFVar3 = deqp::gls::LongStressCase::FeatureProbabilities::pRandomBufferUsage(pFVar3,1.0);
    deqp::gls::LongStressCase::LongStressCase
              (pLVar5,pTVar6,pRVar7,pcVar8,pcVar9,iVar2,iVar1,1,10000,
               (vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_b38,pFVar3,0x88e4,0x88e4,1,false);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
    std::__cxx11::string::~string((string *)&local_d08);
    std::__cxx11::string::~string((string *)&local_d28);
    std::__cxx11::string::~string((string *)&local_d48);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_cc8);
    std::__cxx11::string::~string((string *)&local_ce8);
    std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::~vector
              ((vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_> *)
               local_b38);
    local_954 = local_954 + 1;
    uVar11 = (ulong)local_954;
  }
  return (int)uVar11;
}

Assistant:

void LongRunningTests::init (void)
{
	static const int								Mi			= 1<<20;
	const gls::LongStressTestUtil::ProgramLibrary	progLib		(glu::GLSL_VERSION_300_ES);

	typedef gls::LongStressCase::FeatureProbabilities Probs;

	// Buffer cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			redundantBufferFactor;
			MemCase (const char* n, const char* d, int l, int r) : nameSuffix(n), descSuffix(d), limit(l), redundantBufferFactor(r) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low buffer memory usage limit",	8*Mi,		2),
			MemCase("_high_memory",	"; use a high buffer memory usage limit",	256*Mi,		64)
		};

		const std::vector<gls::ProgramContext> contexts(1, progLib.generateBufferContext(4));

		static const struct Case
		{
			const char* const	name;
			const char*	const	desc;
			const int			redundantBufferFactor; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int bufFact, const Probs& probs_ = Probs()) : name(name_), desc(desc_), redundantBufferFactor(bufFact), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload buffer data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadBuffer(1.0f)),

			Case("always_reupload_bufferdata",
				 "Re-upload buffer data at the beginning of each iteration, using glBufferData",
				 -1,
				 Probs().pReuploadBuffer(1.0f).pReuploadWithBufferData(1.0f)),

			Case("always_delete",
				 "Delete buffers at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteBuffer(1.0f)),

			Case("wasteful",
				 "Don't reuse buffers, and only delete them when given memory limit is reached",
				 2,
				 Probs().pWastefulBufferMemoryUsage(1.0f)),

			Case("separate_attribute_buffers_wasteful",
				 "Give each vertex attribute its own buffer",
				 2,
				 Probs().pSeparateAttribBuffers(1.0f).pWastefulBufferMemoryUsage(1.0f))
		};

		TestCaseGroup* const bufferGroup = new TestCaseGroup(m_context, "buffer", "Buffer stress tests");
		addChild(bufferGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int redundantBufferFactor = cases[caseNdx].redundantBufferFactor > 0 ? cases[caseNdx].redundantBufferFactor : memoryLimitCases[memoryLimitNdx].redundantBufferFactor;

				bufferGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															  (string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															  (string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  0 /* tex memory */, memoryLimitCases[memoryLimitNdx].limit,
															  1 /* draw calls per iteration */, 50000 /* tris per call */,
															  contexts, cases[caseNdx].probs,
															  GL_DYNAMIC_DRAW, GL_DYNAMIC_DRAW,
															  redundantBufferFactor));
			}
		}
	}

	// Texture cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			limit;
			const int			numTextures;
			MemCase (const char* n, const char* d, int l, int t) : nameSuffix(n), descSuffix(d), limit(l), numTextures(t) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low texture memory usage limit",	8*Mi,		6),
			MemCase("_high_memory",	"; use a high texture memory usage limit",	256*Mi,		192)
		};

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			numTextures; //!< If non-positive, taken from memoryLimitCases.
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, int numTextures_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), numTextures(numTextures_), probs(probs_) {}
		} cases[] =
		{
			Case("always_reupload",
				 "Re-upload texture data at the beginning of each iteration",
				 -1,
				 Probs().pReuploadTexture(1.0f)),

			Case("always_reupload_teximage",
				 "Re-upload texture data at the beginning of each iteration, using glTexImage*",
				 -1,
				 Probs().pReuploadTexture(1.0f).pReuploadWithTexImage(1.0f)),

			Case("always_delete",
				 "Delete textures at the end of each iteration, and re-create at the beginning of the next",
				 -1,
				 Probs().pDeleteTexture(1.0f)),

			Case("wasteful",
				 "Don't reuse textures, and only delete them when given memory limit is reached",
				 6,
				 Probs().pWastefulTextureMemoryUsage(1.0f))
		};

		TestCaseGroup* const textureGroup = new TestCaseGroup(m_context, "texture", "Texture stress tests");
		addChild(textureGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
			{
				const int								numTextures		= cases[caseNdx].numTextures > 0 ? cases[caseNdx].numTextures : memoryLimitCases[memoryLimitNdx].numTextures;
				const std::vector<gls::ProgramContext>	contexts		(1, progLib.generateTextureContext(numTextures, 512, 512, 0.1f));

				textureGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
																(string() + cases[caseNdx].name + memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
																(string() + cases[caseNdx].desc + memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
																memoryLimitCases[memoryLimitNdx].limit, 1*Mi /* buf memory */,
																1 /* draw calls per iteration */, 10000 /* tris per call */,
																contexts, cases[caseNdx].probs,
																GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}

	// Draw call cases.

	{
		const std::vector<gls::ProgramContext> contexts(1, progLib.generateTextureContext(1, 128, 128, 0.5f));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const int			drawCallsPerIteration;
			const int			numTrisPerDrawCall;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const int calls, const int tris, const Probs& probs_ = Probs())
				: name(name_), desc(desc_), drawCallsPerIteration(calls), numTrisPerDrawCall(tris), probs(probs_) {}
		} cases[] =
		{
			Case("client_memory_data",
				 "Use client-memory for index and attribute data, instead of GL buffers",
				 200, 500,
				 Probs().pClientMemoryAttributeData(1.0f).pClientMemoryIndexData(1.0f)),

			Case("vary_draw_function",
				 "Choose between glDrawElements and glDrawArrays each iteration, with uniform probability",
				 200, 500,
				 Probs().pUseDrawArrays(0.5f)),

			Case("few_big_calls",
				 "Per iteration, do a few draw calls with a big number of triangles per call",
				 2, 50000),

			Case("many_small_calls",
				 "Per iteration, do many draw calls with a small number of triangles per call",
				 2000, 50)
		};

		TestCaseGroup* const drawCallGroup = new TestCaseGroup(m_context, "draw_call", "Draw call stress tests");
		addChild(drawCallGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			drawCallGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															cases[caseNdx].name, cases[caseNdx].desc,
															1*Mi /* tex memory */, 2*Mi /* buf memory */,
															cases[caseNdx].drawCallsPerIteration, cases[caseNdx].numTrisPerDrawCall,
															contexts, cases[caseNdx].probs,
															GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Shader cases.

	{
		std::vector<gls::ProgramContext> contexts;
		contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
		contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));

		static const struct Case
		{
			const char* const	name;
			const char* const	desc;
			const Probs			probs;
			Case (const char* const name_, const char* const desc_, const Probs& probs_ = Probs()) : name(name_), desc(desc_), probs(probs_) {}
		} cases[] =
		{
			Case("several_programs",
				 "Use several different programs, choosing between them uniformly on each iteration"),

			Case("several_programs_always_rebuild",
				 "Use several different programs, choosing between them uniformly on each iteration, and always rebuild the program",
				 Probs().pRebuildProgram(1.0f))
		};

		TestCaseGroup* const shaderGroup = new TestCaseGroup(m_context, "program", "Shader program stress tests");
		addChild(shaderGroup);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			shaderGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														  cases[caseNdx].name, cases[caseNdx].desc,
														  3*Mi /* tex memory */, 1*Mi /* buf memory */,
														  1 /* draw calls per iteration */, 10000 /* tris per call */,
														  contexts, cases[caseNdx].probs,
														  GL_STATIC_DRAW, GL_STATIC_DRAW));
		}
	}

	// Mixed cases.

	{
		static const struct MemCase
		{
			const char* const	nameSuffix;
			const char* const	descSuffix;
			const int			texLimit;
			const int			bufLimit;
			MemCase (const char* n, const char* d, int t, int b) : nameSuffix(n), descSuffix(d), texLimit(t), bufLimit(b) {}
		} memoryLimitCases[] =
		{
			MemCase("_low_memory",	"; use a low memory usage limit",	8*Mi,	8*Mi),
			MemCase("_high_memory",	"; use a high memory usage limit",	128*Mi,	128*Mi)
		};

		TestCaseGroup* const mixedGroup = new TestCaseGroup(m_context, "mixed", "Mixed stress tests");
		addChild(mixedGroup);

		for (int memoryLimitNdx = 0; memoryLimitNdx < DE_LENGTH_OF_ARRAY(memoryLimitCases); memoryLimitNdx++)
		{
			mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
														 (string() + "buffer_texture_wasteful"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
														 (string() + "Use both buffers and textures wastefully"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
														 memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
														 1 /* draw calls per iteration */, 10000 /* tris per call */,
														 std::vector<gls::ProgramContext>(1, progLib.generateBufferAndTextureContext(4, 512, 512)),
														 Probs()
														 .pReuploadTexture				(0.3f)
														 .pReuploadWithTexImage			(0.5f)
														 .pReuploadBuffer				(0.3f)
														 .pReuploadWithBufferData		(0.5f)
														 .pDeleteTexture				(0.2f)
														 .pDeleteBuffer					(0.2f)
														 .pWastefulTextureMemoryUsage	(0.5f)
														 .pWastefulBufferMemoryUsage	(0.5f)
														 .pRandomBufferUploadTarget		(1.0f)
														 .pRandomBufferUsage			(1.0f),
														 GL_STATIC_DRAW, GL_STATIC_DRAW));

			{
				std::vector<gls::ProgramContext> contexts;
				contexts.push_back(progLib.generateFragmentPointLightContext(512, 512));
				contexts.push_back(progLib.generateVertexUniformLoopLightContext(512, 512));
				mixedGroup->addChild(new gls::LongStressCase(m_context.getTestContext(), m_context.getRenderContext(),
															 (string() + "random"					+ memoryLimitCases[memoryLimitNdx].nameSuffix).c_str(),
															 (string() + "Highly random behavior"	+ memoryLimitCases[memoryLimitNdx].descSuffix).c_str(),
															  memoryLimitCases[memoryLimitNdx].texLimit, memoryLimitCases[memoryLimitNdx].bufLimit,
															 1 /* draw calls per iteration */, 10000 /* tris per call */,
															 contexts,
															 Probs()
															 .pRebuildProgram				(0.3f)
															 .pReuploadTexture				(0.3f)
															 .pReuploadWithTexImage			(0.3f)
															 .pReuploadBuffer				(0.3f)
															 .pReuploadWithBufferData		(0.3f)
															 .pDeleteTexture				(0.2f)
															 .pDeleteBuffer					(0.2f)
															 .pWastefulTextureMemoryUsage	(0.3f)
															 .pWastefulBufferMemoryUsage	(0.3f)
															 .pClientMemoryAttributeData	(0.2f)
															 .pClientMemoryIndexData		(0.2f)
															 .pSeparateAttribBuffers		(0.4f)
															 .pUseDrawArrays				(0.4f)
															 .pRandomBufferUploadTarget		(1.0f)
															 .pRandomBufferUsage			(1.0f),
															 GL_STATIC_DRAW, GL_STATIC_DRAW));
			}
		}
	}
}